

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O2

QByteDataBuffer * __thiscall
QHttp2Stream::takeDownloadBuffer(QByteDataBuffer *__return_storage_ptr__,QHttp2Stream *this)

{
  long in_FS_OFFSET;
  QByteDataBuffer local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.buffers.d.size = 0;
  local_48.bufferCompleteSize = 0;
  local_48.buffers.d.d = (Data *)0x0;
  local_48.buffers.d.ptr = (QByteArray *)0x0;
  local_48.firstPos = 0;
  std::__exchange<QByteDataBuffer,QByteDataBuffer>
            (__return_storage_ptr__,(QByteDataBuffer *)(this + 0x40),&local_48);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteDataBuffer takeDownloadBuffer() noexcept { return std::exchange(m_downloadBuffer, {}); }